

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Quantize_x86::forward(Quantize_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int elempack;
  uint _w;
  uint _h;
  void *pvVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  Mat *pMVar9;
  int iVar10;
  long lVar11;
  byte bVar12;
  long lVar13;
  int *piVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Mat *pMVar18;
  long lVar19;
  bool bVar20;
  Mat local_b8;
  ulong local_70;
  Mat *local_68;
  Mat *local_60;
  size_t local_58;
  ulong local_50;
  size_t local_48;
  int local_3c;
  ulong local_38;
  
  elempack = bottom_blob->elempack;
  iVar8 = bottom_blob->dims;
  _w = bottom_blob->w;
  local_70 = (ulong)_w;
  _h = bottom_blob->h;
  local_58 = (size_t)elempack;
  local_48 = 8;
  local_60 = bottom_blob;
  if (iVar8 == 3) {
    local_38 = (ulong)(uint)bottom_blob->c;
    uVar7 = elempack * bottom_blob->c;
    bVar12 = (uVar7 & 7) == 0 & opt->use_packing_layout;
    if (bVar12 == 0) {
      local_48 = 1;
    }
    uVar16 = (long)(int)uVar7 / (long)(int)local_48;
    local_50 = uVar16 & 0xffffffff;
    Mat::create(top_blob,_w,_h,(int)uVar16,local_48,(int)local_48,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    bVar12 = bVar12 ^ 1;
    if (elempack == 4 && bVar12 == 0) {
      local_3c = _h * (int)local_70;
      uVar16 = 0;
      iVar8 = (int)local_50;
      local_50 = local_50 & 0xffffffff;
      if (iVar8 < 1) {
        local_50 = uVar16;
      }
      lVar11 = 0;
      local_68 = top_blob;
      for (uVar17 = 0; top_blob = local_68, local_50 != uVar17; uVar17 = uVar17 + 1) {
        sVar2 = bottom_blob->cstep;
        pvVar1 = bottom_blob->data;
        sVar6 = bottom_blob->elemsize;
        sVar4 = local_68->cstep;
        sVar5 = local_68->elemsize;
        pvVar3 = local_68->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          local_b8.data = (this->super_Quantize).scale_data.data;
          piVar14 = (this->super_Quantize).scale_data.refcount;
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.dims = (this->super_Quantize).scale_data.dims;
          local_b8.w = (this->super_Quantize).scale_data.w;
          local_b8.h = (this->super_Quantize).scale_data.h;
          local_b8.d = (this->super_Quantize).scale_data.d;
          local_b8.c = (this->super_Quantize).scale_data.c;
          local_b8.cstep = (this->super_Quantize).scale_data.cstep;
          local_b8.refcount = piVar14;
          if (piVar14 == (int *)0x0) goto LAB_003f455b;
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        else {
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.data =
               (void *)(local_b8.elemsize * lVar11 + (long)(this->super_Quantize).scale_data.data);
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.dims = 1;
          local_b8.w = 8;
          local_b8.h = 1;
          local_b8.d = 1;
          local_b8.c = 1;
          local_b8.cstep = 8;
LAB_003f455b:
          piVar14 = (int *)0x0;
        }
        quantize_pack4to8((float *)(sVar2 * uVar16 * sVar6 + (long)pvVar1),
                          (float *)((uVar16 + 1) * sVar2 * sVar6 + (long)pvVar1),
                          (char *)(sVar4 * uVar17 * sVar5 + (long)pvVar3),&local_b8,local_3c);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              free(local_b8.data);
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        lVar11 = lVar11 + 8;
        uVar16 = uVar16 + 2;
      }
    }
    if ((elempack == 4) && (bVar12 != 0)) {
      local_68 = (Mat *)CONCAT44(local_68._4_4_,_h * (int)local_70);
      lVar11 = 0;
      uVar16 = 0;
      if (0 < (int)local_38) {
        uVar16 = local_38 & 0xffffffff;
      }
      for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
        sVar2 = bottom_blob->cstep;
        sVar6 = bottom_blob->elemsize;
        sVar4 = top_blob->cstep;
        pvVar1 = top_blob->data;
        sVar5 = top_blob->elemsize;
        local_b8.data = (this->super_Quantize).scale_data.data;
        pvVar3 = bottom_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar14 = (this->super_Quantize).scale_data.refcount;
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.dims = (this->super_Quantize).scale_data.dims;
          local_b8.w = (this->super_Quantize).scale_data.w;
          local_b8.h = (this->super_Quantize).scale_data.h;
          local_b8.d = (this->super_Quantize).scale_data.d;
          local_b8.c = (this->super_Quantize).scale_data.c;
          local_b8.cstep = (this->super_Quantize).scale_data.cstep;
          local_b8.refcount = piVar14;
          if (piVar14 == (int *)0x0) goto LAB_003f48ad;
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        else {
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.data = (void *)((long)local_b8.data + local_b8.elemsize * lVar11);
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.dims = 1;
          local_b8.w = 4;
          local_b8.h = 1;
          local_b8.d = 1;
          local_b8.c = 1;
          local_b8.cstep = 4;
LAB_003f48ad:
          piVar14 = (int *)0x0;
        }
        quantize_pack4to1((float *)(sVar2 * uVar17 * sVar6 + (long)pvVar3),
                          (char *)(sVar4 * lVar11 * sVar5 + (long)pvVar1),
                          (char *)((lVar11 + 1) * sVar4 * sVar5 + (long)pvVar1),
                          (char *)((lVar11 + 2) * sVar4 * sVar5 + (long)pvVar1),
                          (char *)((lVar11 + 3) * sVar4 * sVar5 + (long)pvVar1),&local_b8,
                          (int)local_68);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              free(local_b8.data);
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        lVar11 = lVar11 + 4;
        bottom_blob = local_60;
      }
    }
    if (elempack != (int)local_48) {
      return 0;
    }
    iVar8 = _h * (int)local_70;
    uVar16 = local_38 & 0xffffffff;
    if ((int)local_38 < 1) {
      uVar16 = 0;
    }
    lVar11 = 0;
    for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
      sVar2 = local_60->cstep;
      sVar6 = local_60->elemsize;
      pvVar1 = local_60->data;
      sVar4 = top_blob->cstep;
      sVar5 = top_blob->elemsize;
      pvVar3 = top_blob->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        local_b8.data = (this->super_Quantize).scale_data.data;
        local_b8.refcount = (this->super_Quantize).scale_data.refcount;
        local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_b8.elempack = (this->super_Quantize).scale_data.elempack;
        local_b8.allocator = (this->super_Quantize).scale_data.allocator;
        local_b8.dims = (this->super_Quantize).scale_data.dims;
        local_b8.w = (this->super_Quantize).scale_data.w;
        local_b8.h = (this->super_Quantize).scale_data.h;
        local_b8.d = (this->super_Quantize).scale_data.d;
        local_b8.c = (this->super_Quantize).scale_data.c;
        local_b8.cstep = (this->super_Quantize).scale_data.cstep;
        if (local_b8.refcount == (int *)0x0) {
          piVar14 = (int *)0x0;
        }
        else {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
          piVar14 = local_b8.refcount;
        }
      }
      else {
        local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_b8.data =
             (void *)(local_b8.elemsize * lVar11 + (long)(this->super_Quantize).scale_data.data);
        local_b8.elempack = (this->super_Quantize).scale_data.elempack;
        local_b8.allocator = (this->super_Quantize).scale_data.allocator;
        local_b8.refcount = (int *)0x0;
        local_b8.c = 1;
        local_b8.w = elempack;
        local_b8.dims = 1;
        local_b8.h = 1;
        local_b8.d = 1;
        local_b8.cstep = local_58;
        piVar14 = (int *)0x0;
      }
      quantize((float *)(sVar2 * uVar17 * sVar6 + (long)pvVar1),
               (char *)(sVar4 * uVar17 * sVar5 + (long)pvVar3),&local_b8,iVar8,elempack);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            free(local_b8.data);
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar11 = lVar11 + local_58;
    }
    return 0;
  }
  if (iVar8 == 2) {
    bVar12 = (elempack * _h & 7) == 0 & opt->use_packing_layout;
    if (bVar12 == 0) {
      local_48 = 1;
    }
    uVar16 = (long)(int)(elempack * _h) / (long)(int)local_48;
    local_68 = (Mat *)(uVar16 & 0xffffffff);
    Mat::create(top_blob,_w,(int)uVar16,local_48,(int)local_48,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    local_50 = CONCAT71(local_50._1_7_,bVar12) ^ 1;
    if (elempack == 4 && bVar12 == 1) {
      uVar16 = 0;
      iVar8 = (int)local_68;
      local_68 = (Mat *)((ulong)local_68 & 0xffffffff);
      if (iVar8 < 1) {
        local_68 = (Mat *)uVar16;
      }
      pMVar9 = (Mat *)0x0;
      for (uVar17 = 0; local_68 != (Mat *)uVar17; uVar17 = uVar17 + 1) {
        pvVar1 = bottom_blob->data;
        lVar11 = (long)bottom_blob->w * bottom_blob->elemsize;
        iVar8 = top_blob->w;
        sVar2 = top_blob->elemsize;
        pvVar3 = top_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          local_b8.data = (this->super_Quantize).scale_data.data;
          piVar14 = (this->super_Quantize).scale_data.refcount;
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.dims = (this->super_Quantize).scale_data.dims;
          local_b8.w = (this->super_Quantize).scale_data.w;
          local_b8.h = (this->super_Quantize).scale_data.h;
          local_b8.d = (this->super_Quantize).scale_data.d;
          local_b8.c = (this->super_Quantize).scale_data.c;
          local_b8.cstep = (this->super_Quantize).scale_data.cstep;
          local_b8.refcount = piVar14;
          if (piVar14 == (int *)0x0) goto LAB_003f432f;
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        else {
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.data =
               (void *)(local_b8.elemsize * (long)pMVar9 +
                       (long)(this->super_Quantize).scale_data.data);
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.dims = 1;
          local_b8.w = 8;
          local_b8.h = 1;
          local_b8.d = 1;
          local_b8.c = 1;
          local_b8.cstep = 8;
LAB_003f432f:
          piVar14 = (int *)0x0;
        }
        local_60 = pMVar9;
        quantize_pack4to8((float *)(lVar11 * uVar16 + (long)pvVar1),
                          (float *)((uVar16 + 1) * lVar11 + (long)pvVar1),
                          (char *)((long)iVar8 * uVar17 * sVar2 + (long)pvVar3),&local_b8,
                          (int)local_70);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              free(local_b8.data);
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar9 = (Mat *)&local_60->refcount;
        uVar16 = uVar16 + 2;
      }
    }
    if ((elempack == 4) && ((char)local_50 != '\0')) {
      lVar11 = 0;
      local_60 = (Mat *)0x0;
      if (0 < (int)_h) {
        local_60 = (Mat *)(ulong)_h;
      }
      for (pMVar9 = (Mat *)0x0; local_60 != pMVar9; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
        iVar8 = bottom_blob->w;
        sVar2 = bottom_blob->elemsize;
        pvVar1 = top_blob->data;
        lVar13 = (long)top_blob->w * top_blob->elemsize;
        local_b8.data = (this->super_Quantize).scale_data.data;
        pvVar3 = bottom_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar14 = (this->super_Quantize).scale_data.refcount;
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.dims = (this->super_Quantize).scale_data.dims;
          local_b8.w = (this->super_Quantize).scale_data.w;
          local_b8.h = (this->super_Quantize).scale_data.h;
          local_b8.d = (this->super_Quantize).scale_data.d;
          local_b8.c = (this->super_Quantize).scale_data.c;
          local_b8.cstep = (this->super_Quantize).scale_data.cstep;
          local_b8.refcount = piVar14;
          if (piVar14 == (int *)0x0) goto LAB_003f4702;
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        else {
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.data = (void *)((long)local_b8.data + local_b8.elemsize * lVar11);
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.dims = 1;
          local_b8.w = 4;
          local_b8.h = 1;
          local_b8.d = 1;
          local_b8.c = 1;
          local_b8.cstep = 4;
LAB_003f4702:
          piVar14 = (int *)0x0;
        }
        quantize_pack4to1((float *)((long)iVar8 * (long)pMVar9 * sVar2 + (long)pvVar3),
                          (char *)(lVar13 * lVar11 + (long)pvVar1),
                          (char *)((lVar11 + 1) * lVar13 + (long)pvVar1),
                          (char *)((lVar11 + 2) * lVar13 + (long)pvVar1),
                          (char *)((lVar11 + 3) * lVar13 + (long)pvVar1),&local_b8,(int)local_70);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              free(local_b8.data);
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        lVar11 = lVar11 + 4;
      }
    }
    if (elempack != (int)local_48) {
      return 0;
    }
    pMVar9 = (Mat *)(ulong)_h;
    if ((int)_h < 1) {
      pMVar9 = (Mat *)0x0;
    }
    lVar11 = 0;
    for (pMVar18 = (Mat *)0x0; pMVar9 != pMVar18; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
      iVar8 = bottom_blob->w;
      sVar2 = bottom_blob->elemsize;
      pvVar1 = bottom_blob->data;
      iVar10 = top_blob->w;
      sVar6 = top_blob->elemsize;
      pvVar3 = top_blob->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        local_b8.data = (this->super_Quantize).scale_data.data;
        local_b8.refcount = (this->super_Quantize).scale_data.refcount;
        local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_b8.elempack = (this->super_Quantize).scale_data.elempack;
        local_b8.allocator = (this->super_Quantize).scale_data.allocator;
        local_b8.dims = (this->super_Quantize).scale_data.dims;
        local_b8.w = (this->super_Quantize).scale_data.w;
        local_b8.h = (this->super_Quantize).scale_data.h;
        local_b8.d = (this->super_Quantize).scale_data.d;
        local_b8.c = (this->super_Quantize).scale_data.c;
        local_b8.cstep = (this->super_Quantize).scale_data.cstep;
        if (local_b8.refcount == (int *)0x0) {
          piVar14 = (int *)0x0;
        }
        else {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
          piVar14 = local_b8.refcount;
        }
      }
      else {
        local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_b8.data =
             (void *)(local_b8.elemsize * lVar11 + (long)(this->super_Quantize).scale_data.data);
        local_b8.elempack = (this->super_Quantize).scale_data.elempack;
        local_b8.allocator = (this->super_Quantize).scale_data.allocator;
        local_b8.refcount = (int *)0x0;
        local_b8.c = 1;
        local_b8.w = elempack;
        local_b8.dims = 1;
        local_b8.h = 1;
        local_b8.d = 1;
        local_b8.cstep = local_58;
        piVar14 = (int *)0x0;
      }
      quantize((float *)((long)iVar8 * (long)pMVar18 * sVar2 + (long)pvVar1),
               (char *)((long)iVar10 * (long)pMVar18 * sVar6 + (long)pvVar3),&local_b8,(int)local_70
               ,elempack);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            free(local_b8.data);
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar11 = lVar11 + local_58;
    }
  }
  else {
    if (iVar8 != 1) {
      return 0;
    }
    if (opt->use_packing_layout == false) {
      local_48 = 1;
    }
    if ((elempack * _w & 7) != 0) {
      local_48 = 1;
    }
    Mat::create(top_blob,(int)(elempack * _w) / (int)local_48,local_48,(int)local_48,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar16 = (long)((ulong)(uint)((int)local_70 >> 0x1f) << 0x20 | local_70 & 0xffffffff) /
             (long)opt->num_threads;
    if ((int)uVar16 < 2) {
      uVar16 = 1;
    }
    iVar8 = (int)uVar16;
    uVar17 = (long)((int)local_70 + iVar8 + -1) / (long)iVar8;
    uVar15 = uVar17 & 0xffffffff;
    if ((int)uVar17 < 1) {
      uVar15 = 0;
    }
    local_58 = local_58 * (uVar16 & 0xffffffff);
    lVar11 = local_58 * 4;
    lVar13 = 0;
    lVar19 = 0;
    local_68 = top_blob;
    while (bVar20 = uVar15 != 0, uVar15 = uVar15 - 1, bVar20) {
      iVar10 = (int)local_70;
      uVar17 = local_70 & 0xffffffff;
      if (iVar8 < iVar10) {
        uVar17 = uVar16 & 0xffffffff;
      }
      quantize((float *)((long)bottom_blob->data + lVar19),(char *)((long)local_68->data + lVar13),
               &(this->super_Quantize).scale_data,(int)uVar17 * elempack,1);
      lVar19 = lVar19 + lVar11;
      lVar13 = lVar13 + local_58;
      local_70 = (ulong)(uint)-(iVar8 - iVar10);
      bottom_blob = local_60;
    }
  }
  return 0;
}

Assistant:

int Quantize_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    if (dims == 1)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = w * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outw = w * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const float* ptr = (const float*)bottom_blob + i * elempack;
            signed char* s8ptr = (signed char*)top_blob + i * elempack;

            // assert scale_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            quantize(ptr, s8ptr, scale_data, size, 1);
        }
    }

    if (dims == 2)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = h * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outh = h * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 2);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 2 + 1);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_i, w);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = bottom_blob.row(i * 2);
                const float* ptr1 = bottom_blob.row(i * 2 + 1);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_i, w);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 4);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 4 + 1);
                signed char* s8ptr2 = top_blob.row<signed char>(i * 4 + 2);
                signed char* s8ptr3 = top_blob.row<signed char>(i * 4 + 3);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_i, w);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_i, w, elempack);
            }
        }
    }

    if (dims == 3)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = channels * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outc = channels * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 2);
                signed char* s8ptr1 = top_blob.channel(q * 2 + 1);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_q, w * h);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* ptr0 = bottom_blob.channel(q * 2);
                const float* ptr1 = bottom_blob.channel(q * 2 + 1);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_q, w * h);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 4);
                signed char* s8ptr1 = top_blob.channel(q * 4 + 1);
                signed char* s8ptr2 = top_blob.channel(q * 4 + 2);
                signed char* s8ptr3 = top_blob.channel(q * 4 + 3);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_q, w * h);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_q, w * h, elempack);
            }
        }
    }

    return 0;
}